

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

uint duckdb_zstd::ZSTD_NbCommonBytes(size_t val)

{
  uint uVar1;
  U64 in_RDI;
  undefined4 local_4;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    uVar1 = MEM_64bits();
    if (uVar1 == 0) {
      local_4 = ZSTD_countLeadingZeros32((U32)in_RDI);
      local_4 = local_4 >> 3;
    }
    else {
      local_4 = ZSTD_countLeadingZeros64(in_RDI);
      local_4 = local_4 >> 3;
    }
  }
  else {
    uVar1 = MEM_64bits();
    if (uVar1 == 0) {
      local_4 = ZSTD_countTrailingZeros32((U32)in_RDI);
      local_4 = local_4 >> 3;
    }
    else {
      local_4 = ZSTD_countTrailingZeros64(in_RDI);
      local_4 = local_4 >> 3;
    }
  }
  return local_4;
}

Assistant:

MEM_STATIC unsigned ZSTD_NbCommonBytes(size_t val)
{
    if (MEM_isLittleEndian()) {
        if (MEM_64bits()) {
            return ZSTD_countTrailingZeros64((U64)val) >> 3;
        } else {
            return ZSTD_countTrailingZeros32((U32)val) >> 3;
        }
    } else {  /* Big Endian CPU */
        if (MEM_64bits()) {
            return ZSTD_countLeadingZeros64((U64)val) >> 3;
        } else {
            return ZSTD_countLeadingZeros32((U32)val) >> 3;
        }
    }
}